

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O2

ulong __thiscall nuraft::inmem_log_store::term_at(inmem_log_store *this,ulong index)

{
  ulong uVar1;
  iterator iVar2;
  key_type local_30;
  ulong local_28;
  
  local_28 = index;
  std::mutex::lock(&this->logs_lock_);
  iVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
          ::find(&(this->logs_)._M_t,&local_28);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->logs_)._M_t._M_impl.super__Rb_tree_header) {
    local_30 = 0;
    iVar2 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
            ::find(&(this->logs_)._M_t,&local_30);
  }
  uVar1 = *(ulong *)iVar2._M_node[1]._M_parent;
  pthread_mutex_unlock((pthread_mutex_t *)&this->logs_lock_);
  return uVar1;
}

Assistant:

ulong inmem_log_store::term_at(ulong index) {
    ulong term = 0;
    {   std::lock_guard<std::mutex> l(logs_lock_);
        auto entry = logs_.find(index);
        if (entry == logs_.end()) {
            entry = logs_.find(0);
        }
        term = entry->second->get_term();
    }
    return term;
}